

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_19ea3::TestStreamingFloatWritesCorrectCharacters::RunImpl
          (TestStreamingFloatWritesCorrectCharacters *this)

{
  TestResults *this_00;
  bool bVar1;
  char *pcVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_1d8;
  undefined1 local_1a8 [8];
  MemoryOutStream stream;
  TestStreamingFloatWritesCorrectCharacters *this_local;
  
  stream._400_8_ = this;
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  std::ostream::operator<<((MemoryOutStream *)local_1a8,3.1415);
  pcVar2 = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  pcVar2 = strstr(pcVar2,"3.1415");
  bVar1 = UnitTest::Check<char_const*>(pcVar2);
  if (!bVar1) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1d8,*ppTVar4,0x40);
    UnitTest::TestResults::OnTestFailure(this_00,&local_1d8,"strstr(stream.GetText(), \"3.1415\")");
  }
  UnitTest::MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1a8);
  return;
}

Assistant:

TEST(StreamingFloatWritesCorrectCharacters)
{
    MemoryOutStream stream;
    stream << 3.1415f;
	CHECK(strstr(stream.GetText(), "3.1415"));
}